

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

SynNamespaceElement * __thiscall
ParseContext::IsNamespace(ParseContext *this,SynNamespaceElement *parent,InplaceStr name)

{
  SynNamespaceElement *pSVar1;
  InplaceStr name_00;
  bool bVar2;
  uint uVar3;
  SynNamespaceElement **ppSVar4;
  SynNamespaceElement *ns_1;
  SynNamespaceElement *pSStack_58;
  uint i_1;
  SynNamespaceElement *current;
  SynNamespaceElement *ns;
  uint i;
  SynNamespaceElement *parent_local;
  ParseContext *this_local;
  InplaceStr name_local;
  
  name_local.begin = name.end;
  this_local = (ParseContext *)name.begin;
  if (parent == (SynNamespaceElement *)0x0) {
    pSStack_58 = this->currentNamespace;
    while( true ) {
      for (ns_1._4_4_ = 0;
          uVar3 = SmallArray<SynNamespaceElement_*,_32U>::size(&this->namespaceList),
          ns_1._4_4_ < uVar3; ns_1._4_4_ = ns_1._4_4_ + 1) {
        ppSVar4 = SmallArray<SynNamespaceElement_*,_32U>::operator[]
                            (&this->namespaceList,ns_1._4_4_);
        pSVar1 = *ppSVar4;
        if ((pSVar1->parent == pSStack_58) &&
           (bVar2 = InplaceStr::operator==(&pSVar1->name->name,(InplaceStr *)&this_local), bVar2)) {
          return pSVar1;
        }
      }
      if (pSStack_58 == (SynNamespaceElement *)0x0) break;
      pSStack_58 = pSStack_58->parent;
    }
    name_local.end = (char *)0x0;
  }
  else {
    for (ns._4_4_ = 0; uVar3 = SmallArray<SynNamespaceElement_*,_32U>::size(&this->namespaceList),
        ns._4_4_ < uVar3; ns._4_4_ = ns._4_4_ + 1) {
      ppSVar4 = SmallArray<SynNamespaceElement_*,_32U>::operator[](&this->namespaceList,ns._4_4_);
      pSVar1 = *ppSVar4;
      if ((pSVar1->parent == parent) &&
         (bVar2 = InplaceStr::operator==(&pSVar1->name->name,(InplaceStr *)&this_local), bVar2)) {
        return pSVar1;
      }
    }
    if (parent->parent == (SynNamespaceElement *)0x0) {
      name_local.end = (char *)0x0;
    }
    else {
      name_00.end = name_local.begin;
      name_00.begin = (char *)this_local;
      name_local.end = (char *)IsNamespace(this,parent->parent,name_00);
    }
  }
  return (SynNamespaceElement *)name_local.end;
}

Assistant:

SynNamespaceElement* ParseContext::IsNamespace(SynNamespaceElement *parent, InplaceStr name)
{
	// In the context of a parent namespace, we only look for immediate children
	if(parent)
	{
		// Search for existing namespace in the same context
		for(unsigned i = 0; i < namespaceList.size(); i++)
		{
			SynNamespaceElement *ns = namespaceList[i];

			if(ns->parent == parent && ns->name->name == name)
				return ns;
		}

		// Try from context of the parent namespace
		if(parent->parent)
			return IsNamespace(parent->parent, name);

		return NULL;
	}

	// Go from the bottom of the namespace stack, trying to find the namespace there
	SynNamespaceElement *current = currentNamespace;

	for(;;)
	{
		for(unsigned i = 0; i < namespaceList.size(); i++)
		{
			SynNamespaceElement *ns = namespaceList[i];

			if(ns->parent == current && ns->name->name == name)
				return ns;
		}

		if(current)
			current = current->parent;
		else
			break;
	}

	return NULL;
}